

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O2

ggml_tensor * ggml_rms_norm_back(ggml_context *ctx,ggml_tensor *a,ggml_tensor *b,float eps)

{
  ggml_tensor *tensor;
  float eps_local;
  
  tensor = ggml_dup_tensor(ctx,a);
  ggml_set_op_params(tensor,&eps_local,4);
  tensor->op = GGML_OP_RMS_NORM_BACK;
  tensor->src[0] = a;
  tensor->src[1] = b;
  return tensor;
}

Assistant:

struct ggml_tensor * ggml_rms_norm_back(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        struct ggml_tensor  * b,
        float                 eps) {
    struct ggml_tensor * result = ggml_dup_tensor(ctx, a);

    ggml_set_op_params(result, &eps, sizeof(eps));

    result->op     = GGML_OP_RMS_NORM_BACK;
    result->src[0] = a;
    result->src[1] = b;

    return result;
}